

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void generate<trng::mt19937>(size_t samples,unsigned_long seed)

{
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  ostream *poVar4;
  char *pcVar5;
  ulong in_RSI;
  ulong in_RDI;
  size_t j;
  mt19937 r;
  undefined4 in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff604;
  ulong local_9e0;
  mt19937 local_9d8;
  ulong local_10;
  ulong local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  trng::mt19937::mt19937((mt19937 *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600));
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar4 = std::operator<<(poVar4,"# generator ");
  pcVar5 = trng::mt19937::name();
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"  seed = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "#==================================================================\n");
  poVar4 = std::operator<<(poVar4,"type: d\n");
  poVar4 = std::operator<<(poVar4,"count: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"numbit: ");
  trng::mt19937::max();
  trng::mt19937::min();
  uVar1 = trng::int_math::log2_ceil<unsigned_int>(0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  std::operator<<(poVar4,'\n');
  for (local_9e0 = 0; local_9e0 < local_8; local_9e0 = local_9e0 + 1) {
    rVar2 = trng::mt19937::operator()(&local_9d8);
    rVar3 = trng::mt19937::min();
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2 - rVar3);
    std::operator<<(poVar4,'\n');
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}